

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleUVRowDown2Box_AVX2(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 *puVar3;
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_ZMM4 [64];
  
  auVar8 = vpcmpeqb_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar8 = vpsrlw_avx2(auVar8,0xf);
  auVar8 = vpackuswb_avx2(auVar8,auVar8);
  auVar6._16_16_ = (undefined1  [16])libyuv::kShuffleSplitUV;
  auVar6._0_16_ = (undefined1  [16])libyuv::kShuffleSplitUV;
  auVar7._16_16_ = (undefined1  [16])libyuv::kShuffleMergeUV;
  auVar7._0_16_ = (undefined1  [16])libyuv::kShuffleMergeUV;
  do {
    auVar5 = *(undefined1 (*) [32])src_ptr;
    puVar3 = *(undefined1 (*) [32])src_ptr;
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar5 = vpshufb_avx2(auVar5,auVar6);
    auVar2 = vpshufb_avx2(*(undefined1 (*) [32])(puVar3 + src_stride),auVar6);
    auVar5 = vpmaddubsw_avx2(auVar5,auVar8);
    auVar2 = vpmaddubsw_avx2(auVar2,auVar8);
    auVar5 = vpaddw_avx2(auVar5,auVar2);
    auVar5 = vpsrlw_avx2(auVar5,1);
    auVar5 = vpavgw_avx2(auVar5,(undefined1  [32])0x0);
    auVar5 = vpshufb_avx2(auVar5,auVar7);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    *(undefined1 (*) [16])dst_ptr = auVar5._0_16_;
    dst_ptr = (uint8_t *)((long)dst_ptr + 0x10);
    iVar4 = dst_width + -8;
    bVar1 = 7 < dst_width;
    dst_width = iVar4;
  } while (iVar4 != 0 && bVar1);
  return;
}

Assistant:

void ScaleUVRowDown2Box_AVX2(const uint8_t* src_ptr,
                             ptrdiff_t src_stride,
                             uint8_t* dst_ptr,
                             int dst_width) {
  asm volatile(
      "vpcmpeqb    %%ymm4,%%ymm4,%%ymm4          \n"  // 01010101
      "vpsrlw      $0xf,%%ymm4,%%ymm4            \n"
      "vpackuswb   %%ymm4,%%ymm4,%%ymm4          \n"
      "vpxor       %%ymm5,%%ymm5,%%ymm5          \n"  // zero
      "vbroadcastf128 %4,%%ymm1                  \n"  // split shuffler
      "vbroadcastf128 %5,%%ymm3                  \n"  // merge shuffler

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"  // 16 UV row 0
      "vmovdqu     0x00(%0,%3,1),%%ymm2          \n"  // 16 UV row 1
      "lea         0x20(%0),%0                   \n"
      "vpshufb     %%ymm1,%%ymm0,%%ymm0          \n"  // uuuuvvvv
      "vpshufb     %%ymm1,%%ymm2,%%ymm2          \n"
      "vpmaddubsw  %%ymm4,%%ymm0,%%ymm0          \n"  // horizontal add
      "vpmaddubsw  %%ymm4,%%ymm2,%%ymm2          \n"
      "vpaddw      %%ymm2,%%ymm0,%%ymm0          \n"  // vertical add
      "vpsrlw      $0x1,%%ymm0,%%ymm0            \n"  // round
      "vpavgw      %%ymm5,%%ymm0,%%ymm0          \n"
      "vpshufb     %%ymm3,%%ymm0,%%ymm0          \n"  // merge uv
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"  // combine qwords
      "vmovdqu     %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"  // 8 UV
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_ptr),                // %0
        "+r"(dst_ptr),                // %1
        "+r"(dst_width)               // %2
      : "r"((intptr_t)(src_stride)),  // %3
        "m"(kShuffleSplitUV),         // %4
        "m"(kShuffleMergeUV)          // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}